

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O1

Matrix * __thiscall Matrix::differentiate(Matrix *this)

{
  uint uVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  int *piVar6;
  int *piVar7;
  void *__s;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  double dVar14;
  
  iVar4 = this->nMatrixDimension;
  uVar1 = iVar4 - 1;
  uVar10 = 0xffffffffffffffff;
  if (0 < iVar4) {
    uVar10 = (long)(int)uVar1 * 4;
  }
  __s = operator_new__(uVar10);
  if (1 < iVar4) {
    memset(__s,0,(ulong)uVar1 << 2);
  }
  pdVar5 = this->pData;
  piVar6 = this->pSize;
  piVar7 = this->pMult;
  bVar8 = false;
  do {
    bVar9 = bVar8;
    if (uVar1 == 0) {
      bVar9 = true;
    }
    lVar13 = (long)(iVar4 + -2);
    if (iVar4 != 1) {
      do {
        bVar9 = bVar8;
        iVar12 = *(int *)((long)__s + lVar13 * 4) + 1;
        *(int *)((long)__s + lVar13 * 4) = iVar12;
        if (iVar12 != piVar6[lVar13]) break;
        *(undefined4 *)((long)__s + lVar13 * 4) = 0;
        lVar11 = lVar13 + -1;
        if (lVar13 == 0) {
          bVar9 = true;
        }
        lVar13 = lVar11;
        bVar8 = bVar9;
      } while (lVar11 != -1);
    }
    if (iVar4 < 2) {
      lVar13 = 0;
    }
    else {
      uVar10 = 0;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + piVar7[uVar10] * *(int *)((long)__s + uVar10 * 4);
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
      lVar13 = (long)iVar12;
    }
    lVar11 = (long)piVar6[(int)uVar1];
    if (1 < lVar11) {
      pdVar2 = pdVar5 + lVar13;
      lVar13 = 1;
      dVar14 = *pdVar2;
      do {
        dVar3 = pdVar2[lVar13];
        pdVar2[lVar13] = dVar3 - dVar14;
        lVar13 = lVar13 + 1;
        dVar14 = dVar3;
      } while (lVar11 != lVar13);
    }
    bVar8 = bVar9;
    if (bVar9) {
      operator_delete__(__s);
      return this;
    }
  } while( true );
}

Assistant:

Matrix &Matrix::differentiate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// differentiate last dimension of this offset
		double last = pData[offset];
		for (int i=1; i<pSize[n]; ++i) {
			double next = pData[offset+i] - last;
			last = pData[offset+i];
			pData[offset+i] = next;
		}
	}
	
	delete[] indices;
	return *this;
}